

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O3

int BN_mask_bits(BIGNUM *a,int n)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  if (n < 0) {
    return 0;
  }
  uVar1 = (uint)n >> 6;
  uVar2 = (ulong)uVar1;
  if (a->top <= (int)uVar1) {
    return 0;
  }
  if ((n & 0x3fU) == 0) {
    a->top = uVar1;
    if ((uint)n < 0x40) goto LAB_00112c06;
  }
  else {
    a->d[uVar2] = a->d[uVar2] & ~(-1L << (sbyte)(n & 0x3fU));
    uVar2 = (ulong)(uVar1 + 1);
  }
  iVar3 = (int)uVar2 + 1;
  do {
    if (a->d[uVar2 - 1] != 0) {
      a->top = (int)uVar2;
      return 1;
    }
    uVar2 = uVar2 - 1;
    iVar3 = iVar3 + -1;
  } while (1 < iVar3);
  a->top = 0;
LAB_00112c06:
  a->neg = 0;
  return 1;
}

Assistant:

int BN_mask_bits(BIGNUM *a, int n)
{
    int b, w;

    bn_check_top(a);
    if (n < 0)
        return 0;

    w = n / BN_BITS2;
    b = n % BN_BITS2;
    if (w >= a->top)
        return 0;
    if (b == 0)
        a->top = w;
    else {
        a->top = w + 1;
        a->d[w] &= ~(BN_MASK2 << b);
    }
    bn_correct_top(a);
    return (1);
}